

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.h
# Opt level: O0

void __thiscall phyr::MemoryPool::stash(MemoryPool *this)

{
  uchar **in_RDI;
  pair<unsigned_char_*,_unsigned_long> pVar1;
  
  if (in_RDI[4] != (uchar *)0x0) {
    pVar1 = std::make_pair<unsigned_char*&,unsigned_long&>(in_RDI,(unsigned_long *)(in_RDI + 8));
    std::__cxx11::
    list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ::push_back((list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                 *)pVar1.second,(value_type *)pVar1.first);
    in_RDI[4] = (uchar *)0x0;
    in_RDI[3] = (uchar *)0x0;
  }
  return;
}

Assistant:

void stash() {
        if (blockPtr) {
            usedBlocks.push_back(std::make_pair(blockPtr, curAllocSize));
            blockPtr = nullptr; curAllocSize = 0;
        }
    }